

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

bool kiste::starts_with(string *text,string *start)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong local_28;
  size_t i;
  string *start_local;
  string *text_local;
  
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < uVar2) {
    text_local._7_1_ = false;
  }
  else {
    for (local_28 = 0; uVar2 = std::__cxx11::string::size(), local_28 < uVar2;
        local_28 = local_28 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)start);
      cVar1 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)text);
      if (cVar1 != *pcVar4) {
        return false;
      }
    }
    text_local._7_1_ = true;
  }
  return text_local._7_1_;
}

Assistant:

bool starts_with(const std::string& text, const std::string& start)
  {
    if (start.size() > text.size())
      return false;
    for (std::size_t i = 0; i < start.size(); ++i)
    {
      if (start[i] != text[i])
      {
        return false;
      }
    }
    return true;
  }